

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeText.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s;
  bool bVar1;
  int iVar2;
  char *incomingText;
  sub_match<const_char_*> *this;
  long lVar3;
  char *translatedString;
  cmatch digits;
  string remainingIncomingString;
  regex digitPattern;
  decodeTextUtil textDecoderUtilInstance;
  int lockParameters [4];
  string_type local_50;
  
  if (argc == 2) {
    do {
      iVar2 = getopt_long(2,argv,"h",longOpts,0);
      if (iVar2 < 0) {
        __s = argv[1];
        incomingText = (char *)malloc(2);
        translatedString = (char *)0x0;
        lockParameters[0] = 0x70f;
        lockParameters[1] = 0xb0e9;
        lockParameters[2] = 0x34536;
        lockParameters[3] = 0;
        decodeTextUtil::decodeTextUtil(&textDecoderUtilInstance,lockParameters,"encoder");
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  (&digitPattern," 0*x*[0-9a-fA-F]{2}",0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&remainingIncomingString,__s,(allocator<char> *)&digits);
        digits.
        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        digits._M_begin = (char *)0x0;
        digits.
        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        digits.
        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        lVar3 = 0;
        while (bVar1 = std::
                       regex_search<char,std::allocator<std::__cxx11::sub_match<char_const*>>,std::__cxx11::regex_traits<char>>
                                 (remainingIncomingString._M_dataplus._M_p,&digits,&digitPattern,0),
              bVar1) {
          this = digits.
                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          if ((long)digits.
                    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)digits.
                    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0x48) {
            this = digits.
                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -3;
          }
          if (digits.
              super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
              .
              super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              digits.
              super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
              .
              super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            this = digits.
                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -3;
          }
          std::__cxx11::sub_match<const_char_*>::str(&local_50,this);
          iVar2 = std::__cxx11::stoi(&local_50,(size_t *)0x0,0x10);
          incomingText[lVar3] = (char)iVar2;
          std::__cxx11::string::~string((string *)&local_50);
          incomingText[lVar3 + 1] = '\0';
          std::__cxx11::string::assign((char *)&remainingIncomingString);
          incomingText = (char *)realloc(incomingText,lVar3 + 3);
          lVar3 = lVar3 + 1;
        }
        decodeTextUtil::translate
                  (&textDecoderUtilInstance,incomingText,&translatedString,(int)lVar3);
        fprintf(_stdout,"%s\n",translatedString);
        free(translatedString);
        free(incomingText);
        std::
        _Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         *)&digits);
        std::__cxx11::string::~string((string *)&remainingIncomingString);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  (&digitPattern);
        decodeTextUtil::~decodeTextUtil(&textDecoderUtilInstance);
        return 0;
      }
    } while ((iVar2 != 1) && (iVar2 != 0x68));
    fprintf(_stderr,"Text Decode VERSION %s\n","0.1");
  }
  fprintf(_stderr,
          "Usage: %s <byte string>\n  a quoted text string containing hex bytes that are encoded messages\n  -h                       : help\n  --help                   : help\n"
          ,*argv);
  return -2;
}

Assistant:

int main(int argc, char *argv[]) {
  int c;

  if (argc != 2) {
    fprintf(stderr, USAGE_STR, argv[0]);
    return -2;
  }

  while ((c = getopt_long(argc, argv, "h", longOpts, NULL)) >= 0) {
    switch (c) {
      case 'h': {
        fprintf(stderr, "Text Decode VERSION %s\n", STR_VALUE(decodeText_VERSION_NUMBER));
        fprintf(stderr, USAGE_STR, argv[0]);
        return -2;
      }
      case 1: {
        fprintf(stderr, "Text Decode VERSION %s\n", STR_VALUE(decodeText_VERSION_NUMBER));
        fprintf(stderr, USAGE_STR, argv[0]);
        return -2;
      }
      default:
        break;
    }
  }

  const char * incomingString = argv[1];
  char * incomingBytes = reinterpret_cast<char *>(malloc(2));

  char * translatedString = 0;

  int lockParameters[] = {1807, 45289, 214326, 0};
  const char * names[] = {"encoder", 0};

  decodeTextUtil textDecoderUtilInstance(lockParameters, *names);

  std::regex digitPattern(" 0*x*[0-9a-fA-F]{2}");
  std::string remainingIncomingString = incomingString;
  std::cmatch digits;
  int index = 0;
  bool none = false;
  do {
    const char * remainingIncoming = remainingIncomingString.c_str();
    if (std::regex_search(remainingIncoming, digits, digitPattern)) {
      incomingBytes[index] = std::stoi(digits[0], 0, 16);
      incomingBytes[index+1] = 0;
      remainingIncomingString = digits[0].second;
      index++;
      incomingBytes = reinterpret_cast<char *>(realloc(incomingBytes, 2 + index));
    } else {
      none = true;
    }
  } while (!none);
  int size = index;
  size = textDecoderUtilInstance.translate(incomingBytes, &translatedString, size);

  fprintf(stdout, "%s\n", translatedString);

  free(translatedString);
  free(incomingBytes);

  return 0;
}